

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  uchar (*pk_parity) [4];
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  FILE *__stream;
  size_t sVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *psVar13;
  secp256k1_context *psVar14;
  secp256k1_scratch *psVar15;
  size_t sVar16;
  void *pvVar17;
  void *pvVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  secp256k1_fe *psVar22;
  void *pvVar23;
  byte *pbVar24;
  ulong uVar25;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_scalar *psVar26;
  secp256k1_context *extraout_RDX;
  int iVar27;
  uchar auVar28 [4];
  secp256k1_gej *a;
  secp256k1_ge_storage (*r_00) [2];
  _func_void_char_ptr_void_ptr *p_Var29;
  secp256k1_keypair *keypair;
  uint uVar30;
  long lVar31;
  undefined1 *puVar32;
  uint uVar33;
  ulong uVar34;
  secp256k1_scalar *psVar35;
  undefined1 *puVar36;
  uint64_t *puVar37;
  secp256k1_ge *psVar38;
  undefined8 *puVar39;
  byte *pbVar40;
  ulong uVar41;
  secp256k1_context *psVar42;
  secp256k1_ge *psVar43;
  secp256k1_scratch *na;
  uint64_t uVar44;
  ulong uVar45;
  char cVar46;
  int iVar47;
  secp256k1_scalar sVar48;
  char *pcVar49;
  uchar *puVar50;
  secp256k1_context *a_00;
  secp256k1_xonly_pubkey *psVar51;
  bool bVar52;
  byte bVar53;
  undefined1 auVar54 [16];
  FILE *pFStack_1b30;
  ulong uStack_1b28;
  ulong uStack_1b20;
  uchar auStack_1b14 [4];
  secp256k1_context *psStack_1b10;
  undefined1 auStack_1b04 [4];
  undefined1 *puStack_1b00;
  undefined1 *puStack_1af8;
  secp256k1_gej *psStack_1af0;
  secp256k1_scalar sStack_1ae4;
  undefined1 auStack_1ae0 [32];
  undefined1 auStack_1ac0 [16];
  undefined1 auStack_1ab0 [16];
  undefined1 auStack_1aa0 [16];
  undefined4 uStack_1a90;
  undefined1 auStack_1a80 [16];
  undefined1 auStack_1a70 [16];
  int iStack_1a54;
  undefined1 auStack_1a50 [96];
  undefined1 auStack_19f0 [16];
  undefined1 auStack_19e0 [16];
  uint64_t uStack_19c8;
  undefined4 uStack_19bc;
  ulong uStack_19b8;
  _func_void_char_ptr_void_ptr *p_Stack_19b0;
  uint64_t *puStack_19a8;
  _func_void_char_ptr_void_ptr *p_Stack_19a0;
  secp256k1_scratch *psStack_1998;
  ulong uStack_1990;
  secp256k1_scratch *psStack_1988;
  undefined1 *puStack_1980;
  ulong uStack_1978;
  undefined1 auStack_1970 [16];
  undefined1 auStack_1960 [16];
  undefined1 auStack_1950 [16];
  undefined1 auStack_1940 [16];
  undefined1 auStack_1810 [32];
  byte abStack_17f0 [8];
  undefined8 auStack_17e8 [3];
  undefined1 auStack_17d0 [16];
  undefined1 auStack_17c0 [16];
  uchar auStack_17b0 [4];
  uchar auStack_17ac [4];
  int iStack_17a8;
  int iStack_17a4;
  secp256k1_keypair sStack_1530;
  secp256k1_context asStack_14d0 [5];
  undefined1 auStack_1050 [16];
  undefined1 auStack_1040 [16];
  uint64_t uStack_1030;
  uint64_t uStack_1028;
  undefined1 auStack_1020 [32];
  undefined4 uStack_1000;
  undefined4 uStack_ffc;
  int iStack_ff8;
  int iStack_ff4;
  int iStack_ff0;
  undefined1 auStack_d50 [32];
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  int iStack_d28;
  int iStack_d24;
  uchar auStack_d20 [8];
  size_t asStack_d18 [2];
  size_t sStack_d08;
  uchar auStack_d00 [4];
  uchar auStack_cfc [4];
  int aiStack_cf8 [4];
  secp256k1_context asStack_ce8 [5];
  secp256k1_ge sStack_870;
  undefined1 auStack_808 [8];
  undefined1 auStack_800 [152];
  secp256k1_context asStack_768 [9];
  secp256k1_fe *psStack_48;
  
  bVar53 = 0;
  secp256k1_fe_verify(r);
  uVar25 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar34 = (uVar25 >> 0x34) + r->n[1];
  uVar20 = (uVar34 >> 0x34) + r->n[2];
  uVar41 = uVar20 & 0xfffffffffffff;
  uVar20 = (uVar20 >> 0x34) + r->n[3];
  uVar21 = (uVar20 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar25 = uVar25 & 0xfffffffffffff;
  uVar45 = (ulong)(0xffffefffffc2e < uVar25 &&
                  ((uVar41 & uVar34 & uVar20) == 0xfffffffffffff && uVar21 == 0xffffffffffff)) |
           uVar21 >> 0x30;
  uVar25 = uVar45 * 0x1000003d1 + uVar25;
  uVar34 = (uVar25 >> 0x34) + (uVar34 & 0xfffffffffffff);
  psVar35 = (secp256k1_scalar *)((uVar34 >> 0x34) + uVar41);
  uVar20 = ((ulong)psVar35 >> 0x34) + (uVar20 & 0xfffffffffffff);
  uVar21 = (uVar20 >> 0x34) + uVar21;
  if ((uint)(ushort)(uVar21 >> 0x30) == (uint)uVar45) {
    r->n[0] = uVar25 & 0xfffffffffffff;
    r->n[1] = uVar34 & 0xfffffffffffff;
    r->n[2] = (ulong)psVar35 & 0xfffffffffffff;
    r->n[3] = uVar20 & 0xfffffffffffff;
    r->n[4] = uVar21 & 0xffffffffffff;
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_normalize_cold_1();
  psStack_48 = r;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar20) {
    lVar9 = strtol(*(char **)(psVar35 + 2),(char **)0x0,0);
    count = (int)lVar9;
  }
  pcVar49 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar20) {
    pcVar49 = *(char **)(psVar35 + 4);
  }
  asStack_14d0[0].ecmult_gen_ctx.built = 0;
  asStack_14d0[0].ecmult_gen_ctx.scalar_offset = 0;
  asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  pFStack_1b30 = (FILE *)(uVar20 & 0xffffffff);
  auStack_1a50._64_8_ = psVar35;
  if ((pcVar49 == (char *)0x0) || (*pcVar49 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00114a33;
    sVar10 = fread(asStack_14d0,1,0x10,__stream);
    if (sVar10 != 0x10) goto LAB_00114a33;
    goto LAB_00111f07;
  }
  iVar47 = 0;
  while ((((iVar47 < 0x10 && (*pcVar49 != '\0')) && (pcVar49[1] != '\0')) &&
         (iVar6 = __isoc99_sscanf(pcVar49,"%2hx",auStack_800), iVar6 == 1))) {
    *(undefined1 *)((long)asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + (long)iVar47 + -8) =
         auStack_800[0];
    pcVar49 = pcVar49 + 2;
    iVar47 = iVar47 + 1;
  }
LAB_00111f14:
  na = (secp256k1_scratch *)((ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  puStack_1b00 = (undefined1 *)((ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x38);
  puStack_1af8 = (undefined1 *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff);
  psStack_1af0 = (secp256k1_gej *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff);
  lVar9 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_14d0[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_800._0_8_ = 0xbb67ae856a09e667;
  auStack_800._8_8_ = 0xa54ff53a3c6ef372;
  auStack_800._16_8_ = 0x9b05688c510e527f;
  auStack_800._24_8_ = 0x5be0cd191f83d9ab;
  auStack_800._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_800,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_800,(uchar *)asStack_14d0,0x10);
  puVar50 = auStack_d50;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_800,puVar50);
  uVar1 = auStack_1a50._64_8_;
  do {
    psVar22 = (secp256k1_fe *)0x0;
    uVar25 = 0;
    do {
      uVar25 = (ulong)puVar50[(long)psVar22] | uVar25 << 8;
      psVar22 = (secp256k1_fe *)((long)psVar22->n + 1);
    } while (psVar22 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar9] = uVar25;
    lVar9 = lVar9 + 1;
    puVar50 = puVar50 + 8;
  } while (lVar9 != 4);
  if (4 < (int)(uint)pFStack_1b30) {
    lVar9 = strtol(*(char **)(auStack_1a50._64_8_ + 0x18),(char **)0x0,0);
    num_cores = (uint32_t)lVar9;
    uVar25 = strtol(*(char **)(uVar1 + 0x20),(char **)0x0,0);
    this_core = (uint32_t)uVar25;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114a59:
      main_cold_2();
      return;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar25 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar42 = (secp256k1_context *)0xd0;
  psVar11 = (secp256k1_ge *)malloc(0xd0);
  if (psVar11 != (secp256k1_ge *)0x0) {
    psVar42 = (secp256k1_context *)0x130;
    psVar12 = (secp256k1_gej *)malloc(0x130);
    if (psVar12 != (secp256k1_gej *)0x0) {
      psVar42 = (secp256k1_context *)0x130;
      psVar13 = (secp256k1_gej *)malloc(0x130);
      if (psVar13 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        asStack_14d0[0].ecmult_gen_ctx.built = 7;
        secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
        secp256k1_gej_set_infinity((secp256k1_gej *)auStack_800);
        uVar30 = 0xff;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
          bVar52 = (7U >> (uVar30 & 0x1f) & 1) != 0;
          psVar22 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar22 >> 8),bVar52);
          if ((uVar30 < 0x20) && (bVar52)) {
            psVar22 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,
                       &secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar52 = uVar30 != 0;
          uVar30 = uVar30 - 1;
        } while (bVar52);
        psVar42 = (secp256k1_context *)auStack_d50;
        secp256k1_gej_double_var
                  ((secp256k1_gej *)psVar42,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0);
        iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar42,&secp256k1_ge_const_g);
        if (iVar47 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_d50);
          lVar9 = -0x98;
          do {
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_d50,(secp256k1_gej *)auStack_d50,
                       (secp256k1_gej *)auStack_800,psVar22);
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0
                      );
            memcpy((void *)((long)psVar12[1].x.n + lVar9),(secp256k1_gej *)auStack_800,0x98);
            if (lVar9 != 0) {
              secp256k1_gej_double_var
                        ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,
                         (secp256k1_fe *)0x0);
            }
            lVar9 = lVar9 + 0x98;
          } while (lVar9 == 0);
          secp256k1_gej_neg(psVar13,(secp256k1_gej *)auStack_d50);
          secp256k1_gej_add_var(psVar13 + 1,psVar13,psVar12,psVar22);
          lVar9 = 0;
          do {
            secp256k1_gej_verify((secp256k1_gej *)((long)(psVar13->x).n + lVar9));
            lVar9 = lVar9 + 0x98;
          } while (lVar9 == 0x98);
          psVar22 = &psVar13->z;
          lVar9 = -1;
          lVar31 = 0;
          psVar38 = psVar11;
          do {
            if ((int)psVar22[1].n[0] == 0) {
              if (lVar9 == -1) {
                uVar44 = psVar22->n[0];
                uVar5 = psVar22->n[1];
                auVar54 = *(undefined1 (*) [16])(psVar22->n + 2);
                uVar4 = *(undefined4 *)((long)psVar22->n + 0x24);
                iVar47 = psVar22->magnitude;
                iVar6 = psVar22->normalized;
                *(int *)((psVar38->x).n + 4) = (int)psVar22->n[4];
                *(undefined4 *)((long)(psVar38->x).n + 0x24) = uVar4;
                (psVar38->x).magnitude = iVar47;
                (psVar38->x).normalized = iVar6;
                *(undefined1 (*) [16])((psVar38->x).n + 2) = auVar54;
                (psVar38->x).n[0] = uVar44;
                (psVar38->x).n[1] = uVar5;
                lVar9 = lVar31;
              }
              else {
                secp256k1_fe_mul(&psVar38->x,&psVar11[lVar9].x,psVar22);
                lVar9 = lVar31;
              }
            }
            else {
              secp256k1_ge_set_infinity(psVar38);
            }
            lVar31 = lVar31 + 1;
            psVar38 = psVar38 + 1;
            psVar22 = (secp256k1_fe *)(psVar22[3].n + 1);
          } while (lVar31 == 1);
          if (lVar9 != -1) {
            psVar42 = (secp256k1_context *)auStack_d50;
            secp256k1_fe_inv_var((secp256k1_fe *)psVar42,&psVar11[lVar9].x);
            if ((lVar9 != 0) && (psVar13->infinity == 0)) {
              psVar42 = (secp256k1_context *)auStack_d50;
              secp256k1_fe_mul(&psVar11[lVar9].x,(secp256k1_fe *)psVar11,(secp256k1_fe *)psVar42);
              secp256k1_fe_mul((secp256k1_fe *)psVar42,(secp256k1_fe *)psVar42,&psVar13[lVar9].z);
              lVar9 = 0;
            }
            if (psVar13[lVar9].infinity != 0) goto LAB_00114acf;
            psVar22 = &psVar11[lVar9].x;
            *(undefined4 *)(psVar22->n + 4) = uStack_d30;
            *(undefined4 *)((long)psVar22->n + 0x24) = uStack_d2c;
            *(int *)(psVar22->n + 4 + 1) = iStack_d28;
            psVar22->normalized = iStack_d24;
            *(undefined1 (*) [16])(psVar11[lVar9].x.n + 2) = auStack_d50._16_16_;
            psVar11[lVar9].x.n[0] = auStack_d50._0_8_;
            psVar11[lVar9].x.n[1] = auStack_d50._8_8_;
            lVar9 = 0;
            a = psVar13;
            do {
              if (a->infinity == 0) {
                psVar38 = (secp256k1_ge *)((long)(psVar11->x).n + lVar9);
                secp256k1_ge_set_gej_zinv(psVar38,a,(secp256k1_fe *)psVar38);
              }
              lVar9 = lVar9 + 0x68;
              a = a + 1;
            } while (lVar9 == 0x68);
            lVar9 = 0;
            do {
              secp256k1_ge_verify((secp256k1_ge *)((long)(psVar11->x).n + lVar9));
              lVar9 = lVar9 + 0x68;
            } while (lVar9 == 0x68);
          }
          r_00 = secp256k1_ecmult_gen_prec_table;
          lVar9 = 0;
          do {
            psVar42 = (secp256k1_context *)((long)(psVar11->x).n + lVar9);
            psVar14 = psVar42;
            secp256k1_ge_verify((secp256k1_ge *)psVar42);
            if (*(int *)((long)(&psVar11->y + 1) + lVar9) != 0) goto LAB_00114a70;
            secp256k1_ge_to_storage(*r_00,(secp256k1_ge *)psVar42);
            lVar9 = lVar9 + 0x68;
            r_00 = (secp256k1_ge_storage (*) [2])((long)r_00 + 0x40);
          } while (lVar9 == 0x68);
          free(psVar13);
          free(psVar12);
          free(psVar11);
          secp256k1_gej_set_ge((secp256k1_gej *)auStack_800,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_800,gen);
          iVar47 = 0x80;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_800,(secp256k1_gej *)auStack_800,(secp256k1_fe *)0x0
                      );
            iVar47 = iVar47 + -1;
          } while (iVar47 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_800,gen_00);
          iVar47 = count;
joined_r0x0011246c:
          count = iVar47 + -1;
          if (iVar47 == 0) {
            testrand256((uchar *)asStack_14d0);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,asStack_14d0[0].ecmult_gen_ctx._0_8_ & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
                   (ulong)asStack_14d0[0].ecmult_gen_ctx._0_8_ >> 0x38,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
                   asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
            puts("no problems found");
            return;
          }
          psVar14 = secp256k1_context_create(1);
          testrand256(abStack_17f0);
          psVar42 = psVar14;
          iVar47 = secp256k1_context_randomize(psVar14,abStack_17f0);
          if (iVar47 == 0) goto LAB_00114ad4;
          psStack_1b10 = psVar14;
          auStack_1a50._56_8_ = psVar14;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_800);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_d50,(secp256k1_gej *)auStack_800);
          iVar47 = 1;
          lVar9 = -0x4e0;
          psVar12 = (secp256k1_gej *)auStack_800;
          do {
            psVar13 = psVar12 + 1;
            secp256k1_gej_add_ge(psVar13,psVar12,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_808 + lVar9),psVar13);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)asStack_14d0);
              secp256k1_gej_rescale(psVar13,(secp256k1_fe *)asStack_14d0);
            }
            auStack_17d0._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_17d0);
            secp256k1_ecmult_gen
                      (&psStack_1b10->ecmult_gen_ctx,(secp256k1_gej *)asStack_14d0,
                       (secp256k1_scalar *)auStack_17d0);
            psVar14 = (secp256k1_context *)auStack_1050;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar14,(secp256k1_gej *)asStack_14d0);
            if (*(int *)(auStack_800 + lVar9 + 0x58) != 0) goto LAB_00114a75;
            if (iStack_ff0 != 0) goto LAB_00114a7a;
            psVar14 = (secp256k1_context *)auStack_1050;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar14,(secp256k1_fe *)(auStack_808 + lVar9)
                                      );
            if (iVar6 == 0) goto LAB_00114a7f;
            psVar14 = (secp256k1_context *)auStack_1020;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar14,
                                       (secp256k1_fe *)(auStack_800 + lVar9 + 0x28));
            if (iVar6 == 0) goto LAB_00114a84;
            iVar47 = iVar47 + 1;
            lVar9 = lVar9 + 0x68;
            psVar12 = psVar13;
          } while (lVar9 != 0);
          uVar25 = 0;
          puVar36 = auStack_d50;
          lVar9 = 0;
          do {
            psVar14 = (secp256k1_context *)(puVar36 + (uVar25 / 0xd) * -0x548);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)asStack_14d0,(secp256k1_ge *)(auStack_d50 + lVar9));
            iVar47 = secp256k1_ge_eq_var((secp256k1_ge *)psVar14,(secp256k1_ge *)asStack_14d0);
            if (iVar47 == 0) goto LAB_00114a89;
            lVar9 = lVar9 + 0x68;
            puVar36 = puVar36 + 0x3a8;
            uVar25 = uVar25 + 9;
          } while (lVar9 != 0x548);
          psVar42 = (secp256k1_context *)auStack_d50;
          secp256k1_ge_verify((secp256k1_ge *)psVar42);
          if (aiStack_cf8[2] == 0) goto LAB_00114ad9;
          psVar42 = (secp256k1_context *)auStack_800;
          secp256k1_gej_verify((secp256k1_gej *)psVar42);
          if (auStack_800._144_4_ == 0) goto LAB_00114ade;
          lVar9 = 0xc;
          psVar42 = asStack_ce8;
          a_00 = (secp256k1_context *)(auStack_800 + 0x98);
          do {
            psVar14 = psVar42;
            secp256k1_ge_verify((secp256k1_ge *)psVar42);
            if ((psVar42->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114a8e;
            psVar14 = a_00;
            secp256k1_gej_verify((secp256k1_gej *)a_00);
            if ((int)(a_00->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114a93;
            a_00 = (secp256k1_context *)&(a_00->ecmult_gen_ctx).proj_blind.magnitude;
            psVar42 = (secp256k1_context *)&(psVar42->ecmult_gen_ctx).ge_offset.infinity;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          puStack_1b00 = auStack_d50;
          uStack_1b28 = 0;
          puStack_1af8 = (undefined1 *)0x0;
          do {
            bVar52 = true;
            if ((ulong)num_cores != 1) {
              puStack_1af8 = puStack_1af8 + -0x18fc812e5f4bd725;
              bVar52 = (uint32_t)
                       (((ulong)puStack_1af8 >> 0x20 ^ (ulong)puStack_1af8 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar52) {
              lVar9 = uStack_1b28 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_17d0,
                               (secp256k1_fe *)(auStack_800 + lVar9 + 0x60));
              lVar31 = 0;
              puVar36 = puStack_1b00;
              uVar25 = uStack_1b28;
              do {
                psVar11 = (secp256k1_ge *)(puVar36 + (uVar25 / 0xd) * -0x548);
                psVar12 = (secp256k1_gej *)(auStack_800 + lVar31);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,
                           (secp256k1_gej *)(auStack_800 + lVar9),(secp256k1_fe *)0x4ec4ec4ec4ec4ec5
                          );
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) {
                  main_cold_64();
LAB_00114a4a:
                  main_cold_63();
LAB_00114a4f:
                  main_cold_62();
LAB_00114a54:
                  main_cold_9();
                  goto LAB_00114a59;
                }
                if (uStack_1b28 != 0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)asStack_14d0,psVar12,
                             (secp256k1_ge *)(auStack_d50 + uStack_1b28 * 0x68));
                  iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                  if (iVar47 != 0) goto LAB_0011289f;
                  goto LAB_00114a54;
                }
LAB_0011289f:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,
                           (secp256k1_ge *)(auStack_d50 + uStack_1b28 * 0x68),(secp256k1_fe *)0x0);
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) goto LAB_00114a4a;
                iStack_ff0 = *(int *)(auStack_800 + lVar9 + 0x90);
                uStack_1030 = *(uint64_t *)(auStack_800 + lVar9 + 0x20);
                uStack_1028 = *(uint64_t *)(auStack_800 + lVar9 + 0x28);
                auStack_1040._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x18);
                auStack_1040._0_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x10);
                auStack_1050._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 8);
                auStack_1050._0_8_ = (((secp256k1_gej *)(auStack_800 + lVar9))->x).n[0];
                auStack_1020._0_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x30);
                auStack_1020._8_8_ = *(undefined8 *)(auStack_800 + lVar9 + 0x38);
                auStack_1020._16_16_ = *(undefined1 (*) [16])(auStack_800 + lVar9 + 0x40);
                uStack_1000 = *(undefined4 *)(auStack_800 + lVar9 + 0x50);
                uStack_ffc = *(undefined4 *)(auStack_800 + lVar9 + 0x54);
                iStack_ff8 = *(int *)(auStack_800 + lVar9 + 0x58);
                iStack_ff4 = *(int *)(auStack_800 + lVar9 + 0x5c);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)asStack_14d0,psVar12,(secp256k1_ge *)auStack_1050,
                           (secp256k1_fe *)auStack_17d0);
                iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
                if (iVar47 == 0) goto LAB_00114a4f;
                lVar31 = lVar31 + 0x98;
                puVar36 = puVar36 + 0x68;
                uVar25 = uVar25 + 1;
              } while (lVar31 != 0x7b8);
            }
            uStack_1b28 = uStack_1b28 + 1;
            puStack_1b00 = puStack_1b00 + 0x68;
          } while (uStack_1b28 != 0xd);
          uVar25 = 0;
          puVar36 = auStack_d50;
          lVar9 = 0;
          do {
            psVar42 = asStack_14d0;
            secp256k1_gej_double((secp256k1_gej *)psVar42,(secp256k1_gej *)(auStack_800 + lVar9));
            psVar14 = psVar42;
            iVar47 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar42,
                                (secp256k1_ge *)(puVar36 + (uVar25 / 0xd) * -0x548));
            if (iVar47 == 0) goto LAB_00114a9d;
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar42,(secp256k1_gej *)(auStack_800 + lVar9),
                       (secp256k1_fe *)0x0);
            iVar47 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar42,
                                (secp256k1_ge *)(puVar36 + (uVar25 / 0xd) * -0x548));
            if (iVar47 == 0) goto LAB_00114aa2;
            lVar9 = lVar9 + 0x98;
            puVar36 = puVar36 + 0xd0;
            uVar25 = uVar25 + 2;
          } while (lVar9 != 0x7b8);
          lVar9 = 0x68;
          psVar11 = &sStack_870;
          psVar12 = (secp256k1_gej *)(auStack_800 + 0x98);
          do {
            psVar42 = (secp256k1_context *)auStack_1050;
            secp256k1_ge_neg((secp256k1_ge *)psVar42,(secp256k1_ge *)(auStack_d50 + lVar9));
            iVar47 = secp256k1_ge_eq_var((secp256k1_ge *)psVar42,psVar11);
            if (iVar47 == 0) goto LAB_00114aa7;
            secp256k1_gej_neg((secp256k1_gej *)asStack_14d0,psVar12);
            psVar42 = asStack_14d0;
            iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_14d0,psVar11);
            if (iVar47 == 0) goto LAB_00114aac;
            lVar9 = lVar9 + 0x68;
            psVar12 = psVar12 + 1;
            psVar11 = psVar11 + -1;
          } while (lVar9 != 0x548);
          puVar36 = (undefined1 *)0x1;
          uStack_1b20 = 0x68;
          psStack_1af0 = (secp256k1_gej *)0x0;
LAB_00112ac6:
          lVar9 = (long)puVar36 * 0x98;
          pFStack_1b30 = (FILE *)0x0;
          puStack_1af8 = auStack_d50;
          puStack_1b00 = puVar36;
          while( true ) {
            bVar52 = true;
            if ((ulong)num_cores != 1) {
              psStack_1af0 = (secp256k1_gej *)((long)psStack_1af0[-0x2a150f76858d35].y.n + 0x23);
              bVar52 = (uint32_t)
                       (((ulong)psStack_1af0 >> 0x20 ^ (ulong)psStack_1af0 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar52) break;
LAB_00112c17:
            pFStack_1b30 = (FILE *)((long)&pFStack_1b30->_flags + 1);
            puStack_1af8 = puStack_1af8 + 0x68;
            if ((int)pFStack_1b30 == 0xd) goto code_r0x00112c31;
          }
          iVar47 = 0;
          puVar32 = puStack_1af8;
          __stream = pFStack_1b30;
          while( true ) {
            auStack_1a50._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1a80._0_4_ = (int)pFStack_1b30;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1ac0._8_8_ = auStack_1050;
            auStack_1ac0._0_8_ = auStack_17d0;
            auStack_1ab0._0_8_ = asStack_14d0;
            na = (secp256k1_scratch *)auStack_1a50;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1ac0,(secp256k1_gej *)auStack_1970,1,
                       (secp256k1_gej *)(auStack_800 + lVar9),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1a80);
            iVar6 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1970,
                               (secp256k1_ge *)(puVar32 + ((ulong)__stream / 0xd) * -0x548));
            if (iVar6 == 0) break;
            iVar47 = iVar47 + 1;
            puVar32 = puVar32 + uStack_1b20;
            __stream = (FILE *)((long)&__stream->_flags + (long)puStack_1b00);
            puVar36 = puStack_1b00;
            if (iVar47 == 0xd) goto LAB_00112c17;
          }
          main_cold_57();
LAB_00114a33:
          main_cold_1();
LAB_00111f07:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_00111f14;
        }
        goto LAB_00114aca;
      }
      goto LAB_00114aed;
    }
    goto LAB_00114ae8;
  }
LAB_00114ae3:
  main_cold_74();
LAB_00114ae8:
  main_cold_73();
LAB_00114aed:
  main_cold_72();
LAB_00114af2:
  main_cold_11();
LAB_00114af7:
  main_cold_12();
LAB_00114afc:
  main_cold_13();
LAB_00114b01:
  main_cold_14();
LAB_00114b06:
  main_cold_10();
LAB_00114b0b:
  main_cold_15();
LAB_00114b10:
  main_cold_16();
LAB_00114b15:
  main_cold_49();
LAB_00114b1a:
  main_cold_17();
LAB_00114b1f:
  main_cold_18();
LAB_00114b24:
  main_cold_19();
LAB_00114b29:
  main_cold_20();
LAB_00114b2e:
  main_cold_21();
LAB_00114b33:
  main_cold_48();
LAB_00114b38:
  main_cold_47();
LAB_00114b3d:
  main_cold_46();
LAB_00114b42:
  main_cold_45();
LAB_00114b47:
  main_cold_44();
LAB_00114b4c:
  main_cold_43();
LAB_00114b51:
  main_cold_22();
LAB_00114b56:
  main_cold_42();
LAB_00114b5b:
  main_cold_23();
LAB_00114b60:
  main_cold_41();
LAB_00114b65:
  main_cold_24();
LAB_00114b6a:
  main_cold_40();
LAB_00114b6f:
  main_cold_39();
LAB_00114b74:
  main_cold_25();
LAB_00114b79:
  main_cold_26();
LAB_00114b7e:
  main_cold_27();
LAB_00114b83:
  main_cold_28();
LAB_00114b88:
  main_cold_38();
LAB_00114b8d:
  main_cold_37();
LAB_00114b92:
  main_cold_36();
LAB_00114b97:
  main_cold_35();
LAB_00114b9c:
  main_cold_29();
LAB_00114ba1:
  main_cold_30();
LAB_00114ba6:
  main_cold_31();
LAB_00114bab:
  main_cold_32();
LAB_00114bb0:
  main_cold_34();
LAB_00114bb5:
  main_cold_33();
  lVar9 = 0;
  do {
    uVar44 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar21 = secp256k1_test_state[1] << 0x11;
    uVar20 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar25 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar20;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar25;
    secp256k1_test_state[3] = uVar25 << 0x2d | uVar25 >> 0x13;
    secp256k1_test_state[2] = uVar20 ^ uVar21;
    (psVar42->ecmult_gen_ctx).ge_offset.x.n[lVar9 + -1] = uVar44;
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 4);
  return;
code_r0x00112c31:
  puVar36 = puVar36 + 1;
  uStack_1b20 = uStack_1b20 + 0x68;
  if (puVar36 == (undefined1 *)0xd) goto code_r0x00112c44;
  goto LAB_00112ac6;
code_r0x00112c44:
  lVar9 = 0;
  do {
    lVar31 = 0;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        psStack_1af0 = (secp256k1_gej *)((long)psStack_1af0[-0x2a150f76858d35].y.n + 0x23);
        bVar52 = (uint32_t)
                 (((ulong)psStack_1af0 >> 0x20 ^ (ulong)psStack_1af0 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        auStack_1ac0._0_4_ = (int)lVar9;
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
        psVar11 = (secp256k1_ge *)(auStack_d50 + lVar31 * 0x68);
        psVar42 = asStack_14d0;
        secp256k1_ecmult_const((secp256k1_gej *)psVar42,psVar11,(secp256k1_scalar *)auStack_1ac0);
        uVar30 = (int)lVar31 * (int)lVar9;
        psVar38 = (secp256k1_ge *)
                  (auStack_d50 + (ulong)(uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc)) * 0x68);
        iVar47 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar42,psVar38);
        if (iVar47 == 0) goto LAB_00114ab1;
        if (lVar31 != 0 && lVar9 != 0) {
          psVar14 = (secp256k1_context *)auStack_1970;
          psVar42 = psVar14;
          iVar47 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar11,(secp256k1_fe *)0x0,
                              (secp256k1_scalar *)auStack_1ac0,0);
          if (iVar47 == 0) goto LAB_00114ab6;
          iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar38);
          if (iVar47 == 0) goto LAB_00114abb;
          do {
            psVar14 = (secp256k1_context *)auStack_17d0;
            testutil_random_fe((secp256k1_fe *)psVar14);
            secp256k1_fe_verify((secp256k1_fe *)psVar14);
            if (iStack_17a4 == 0) {
              main_cold_53();
              goto LAB_00114a70;
            }
          } while ((SUB168(auStack_17c0 | auStack_17d0,8) == 0 &&
                   SUB168(auStack_17c0 | auStack_17d0,0) == 0) &&
                   CONCAT44(auStack_17ac,auStack_17b0) == 0);
          secp256k1_fe_mul((secp256k1_fe *)auStack_1050,(secp256k1_fe *)auStack_17d0,
                           (secp256k1_fe *)psVar11);
          psVar42 = (secp256k1_context *)auStack_1970;
          na = (secp256k1_scratch *)0x0;
          psVar14 = psVar42;
          iVar47 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar42,(secp256k1_fe *)auStack_1050,
                              (secp256k1_fe *)auStack_17d0,(secp256k1_scalar *)auStack_1ac0,0);
          if (iVar47 == 0) goto LAB_00114ac0;
          iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar42,(secp256k1_fe *)psVar38);
          if (iVar47 == 0) goto LAB_00114ac5;
        }
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != 0xd);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xd);
  psVar15 = (secp256k1_scratch *)malloc(0x1020);
  if (psVar15 == (secp256k1_scratch *)0x0) {
    (*(psStack_1b10->error_callback).fn)("Out of memory",(psStack_1b10->error_callback).data);
  }
  else {
    psVar15->magic[0] = '\0';
    psVar15->magic[1] = '\0';
    psVar15->magic[2] = '\0';
    psVar15->magic[3] = '\0';
    psVar15->magic[4] = '\0';
    psVar15->magic[5] = '\0';
    psVar15->magic[6] = '\0';
    psVar15->magic[7] = '\0';
    psVar15->data = (void *)0x0;
    psVar15->alloc_size = 0;
    psVar15->max_size = 0;
    builtin_memcpy(psVar15->magic,"scratch",8);
    psVar15->data = psVar15 + 1;
    psVar15->max_size = 0x1000;
  }
  auStack_1a50._56_8_ = auStack_1a50._56_8_ + 0xb0;
  auStack_1a50._72_8_ = 0;
  uStack_19b8 = 0;
  psStack_1998 = psVar15;
  do {
    auStack_1a50._88_8_ = 0;
    do {
      auStack_1a50._80_8_ = 0;
      do {
        uStack_19c8 = 0;
        do {
          uVar25 = (ulong)num_cores;
          bVar52 = true;
          if (uVar25 != 1) {
            uStack_19b8 = uStack_19b8 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)((uStack_19b8 >> 0x20 ^ uStack_19b8 & 0xffffffff) * uVar25 >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            puStack_19a8 = (uint64_t *)(auStack_d50 + uStack_19c8 * 0x68);
            p_Stack_19b0 = (_func_void_char_ptr_void_ptr *)
                           (uStack_19c8 * auStack_1a50._72_8_ + auStack_1a50._80_8_);
            p_Var29 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              asStack_14d0[0].ecmult_gen_ctx.built = (int)auStack_1a50._72_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)asStack_14d0);
              asStack_14d0[0].ecmult_gen_ctx.scalar_offset = (int)auStack_1a50._88_8_;
              secp256k1_scalar_verify(&asStack_14d0[0].ecmult_gen_ctx.scalar_offset);
              auStack_1a50._0_4_ = (int)auStack_1a50._80_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
              puVar37 = puStack_19a8;
              psVar11 = &asStack_14d0[0].ecmult_gen_ctx.ge_offset;
              for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
                (psVar11->x).n[0] = *puVar37;
                puVar37 = puVar37 + (ulong)bVar53 * -2 + 1;
                psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar53 * -2 + 1) * 8);
              }
              p_Stack_19a0 = p_Var29;
              puVar37 = (uint64_t *)(auStack_d50 + (long)p_Var29 * 0x68);
              psVar22 = &asStack_14d0[0].ecmult_gen_ctx.proj_blind;
              for (pvVar23 = (void *)0xd; pvVar23 != (void *)0x0;
                  pvVar23 = (void *)((long)pvVar23 + -1)) {
                psVar22->n[0] = *puVar37;
                puVar37 = puVar37 + (ulong)bVar53 * -2 + 1;
                psVar22 = (secp256k1_fe *)((long)psVar22 + ((ulong)bVar53 * -2 + 1) * 8);
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_17d0);
              if (psVar15 == (secp256k1_scratch *)0x0) {
LAB_001130d1:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)auStack_17d0,(secp256k1_scalar *)auStack_1a50,
                           (secp256k1_ecmult_multi_callback *)asStack_14d0,pvVar23,(size_t)na);
              }
              else {
                sVar16 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1a50._56_8_,psVar15,6);
                pvVar23 = (void *)0x1;
                na = (secp256k1_scratch *)&DAT_00122718;
                uVar25 = 0;
                do {
                  if (pvVar23 == (void *)0xd) break;
                  if (pvVar23 < (void *)0xd) {
                    uVar20 = *(ulong *)na->magic;
                  }
                  else {
                    uVar20 = 0;
                  }
                  bVar52 = false;
                  uVar21 = 0x7f / (ulong)((int)pvVar23 + 1);
                  uVar34 = (0x98L << ((byte)pvVar23 & 0x3f)) + uVar21 * 8 + 0x118;
                  if (uVar34 <= sVar16) {
                    uVar21 = (sVar16 - uVar34) / (uVar21 * 8 + 0x108);
                    bVar52 = uVar20 <= uVar21;
                    if (!bVar52) {
                      uVar20 = uVar21;
                    }
                    if (uVar25 < uVar20) {
                      uVar25 = uVar20;
                    }
                  }
                  na = (secp256k1_scratch *)&na->data;
                  pvVar23 = (void *)((long)pvVar23 + 1);
                } while (bVar52);
                if (uVar25 == 0) goto LAB_001130d1;
                sVar16 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1a50._56_8_,psVar15,5);
                pvVar23 = (void *)(sVar16 - 0xe18);
                bVar52 = pvVar23 < (void *)0xfffffffffffff8f4;
                if (sVar16 < 0x70c) {
                  bVar52 = uVar25 != 1;
                }
                uVar25 = (ulong)bVar52 + 1;
                if (sVar16 < 0x70c) goto LAB_001130d1;
                uStack_1978 = (ulong)(pvVar23 < (void *)0xfffffffffffff8f4);
                uStack_1b28 = 2;
                puStack_1980 = (undefined1 *)(2 - uStack_1978);
                puVar36 = (undefined1 *)0x0;
                uStack_1990 = uVar25;
                do {
                  uVar20 = uVar25;
                  if (uStack_1b28 < uVar25) {
                    uVar20 = uStack_1b28;
                  }
                  lVar9 = (long)puVar36 << ((byte)uStack_1978 & 0x3f);
                  auStack_1a50._64_8_ = auStack_1a50;
                  if (puVar36 != (undefined1 *)0x0) {
                    auStack_1a50._64_8_ = (secp256k1_scalar *)0x0;
                  }
                  psVar12 = (secp256k1_gej *)0x0;
                  psVar35 = (secp256k1_scalar *)auStack_1a50._64_8_;
                  do {
                    psVar26 = (secp256k1_scalar *)((ulong)psVar35 & 0xffffffff);
                    bVar2 = psVar15->magic[(long)(psVar12->x).n];
                    bVar3 = *(byte *)((long)psVar12[0x1e77].y.n + 0x21);
                    psVar35 = (secp256k1_scalar *)(ulong)((uint)bVar2 - (uint)bVar3);
                    if (bVar2 == bVar3) {
                      psVar35 = psVar26;
                    }
                    iVar47 = (int)psVar35;
                    if (bVar2 != bVar3) goto LAB_001131e5;
                    psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
                  } while (psVar12 != (secp256k1_gej *)0x8);
                  iVar47 = 0;
LAB_001131e5:
                  if (iVar47 == 0) {
                    puStack_1af8 = (undefined1 *)psVar15->alloc_size;
                  }
                  else {
                    (*(psStack_1b10->error_callback).fn)
                              ("invalid scratch space",(psStack_1b10->error_callback).data);
                    puStack_1af8 = (undefined1 *)0x0;
                  }
                  puStack_1b00 = puVar36;
                  secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1050);
                  uVar1 = auStack_1a50._56_8_;
                  if (uStack_1b28 == 0 && puVar36 != (undefined1 *)0x0) {
                    cVar46 = '\0';
                  }
                  else {
                    psStack_1af0 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)auStack_1a50._56_8_,psVar15,
                                              uVar20 * 0x98);
                    psStack_1988 = (secp256k1_scratch *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)uVar1,psVar15,uVar20 * 4);
                    pvVar23 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar15,uVar20 * 0xc0);
                    auStack_1ac0._0_8_ = pvVar23;
                    pvVar17 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar15,uVar20 * 0x1a0);
                    auStack_1ac0._8_8_ = pvVar17;
                    pvVar18 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar15,uVar20 * 0x410);
                    psVar15 = psStack_1988;
                    auStack_1ab0._0_8_ = pvVar18;
                    auVar54._0_4_ =
                         -(uint)((int)psStack_1af0 == 0 && (int)((ulong)psStack_1af0 >> 0x20) == 0);
                    auVar54._4_4_ =
                         -(uint)((int)psStack_1988 == 0 && (int)((ulong)psStack_1988 >> 0x20) == 0);
                    auVar54._8_4_ = -(uint)((int)pvVar23 == 0 && (int)((ulong)pvVar23 >> 0x20) == 0)
                    ;
                    auVar54._12_4_ =
                         -(uint)((int)pvVar17 == 0 && (int)((ulong)pvVar17 >> 0x20) == 0);
                    iVar47 = movmskps((int)psVar12,auVar54);
                    psVar12 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44((int)((ulong)psVar12 >> 0x20),iVar47) >> 8),
                                       iVar47 != 0 || pvVar18 == (void *)0x0);
                    uStack_19bc = (int)psVar12;
                    if (iVar47 == 0 && pvVar18 != (void *)0x0) {
                      if (uStack_1b28 != 0) {
                        psVar11 = &asStack_14d0[0].ecmult_gen_ctx.ge_offset + lVar9;
                        sVar16 = 0;
                        psVar12 = psStack_1af0;
                        do {
                          *(undefined4 *)(psVar15->magic + sVar16 * 4) =
                               *(undefined4 *)
                                ((long)asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n +
                                sVar16 * 4 + lVar9 * 4 + -8);
                          psVar38 = psVar11;
                          psVar43 = (secp256k1_ge *)auStack_1970;
                          for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
                            (psVar43->x).n[0] = (psVar38->x).n[0];
                            psVar38 = (secp256k1_ge *)((long)psVar38 + ((ulong)bVar53 * -2 + 1) * 8)
                            ;
                            psVar43 = (secp256k1_ge *)((long)psVar43 + (ulong)bVar53 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar12,(secp256k1_ge *)auStack_1970);
                          sVar16 = sVar16 + 1;
                          psVar12 = psVar12 + 1;
                          psVar11 = psVar11 + 1;
                        } while (uVar20 != sVar16);
                      }
                      psVar12 = psStack_1af0;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1ac0,
                                 (secp256k1_gej *)auStack_1050,uVar20,psStack_1af0,
                                 (secp256k1_scalar *)psVar15,(secp256k1_scalar *)auStack_1a50._64_8_
                                );
                      na = psVar15;
                    }
                    psVar15 = psStack_1998;
                    secp256k1_scratch_apply_checkpoint
                              ((secp256k1_callback *)auStack_1a50._56_8_,psStack_1998,
                               (size_t)puStack_1af8);
                    cVar46 = (char)uStack_19bc;
                    uVar25 = uStack_1990;
                  }
                  puVar36 = puStack_1b00;
                  if (cVar46 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_17d0,(secp256k1_gej *)auStack_17d0,
                               (secp256k1_gej *)auStack_1050,&psVar12->x);
                    uStack_1b28 = uStack_1b28 - uVar20;
                  }
                  puVar36 = puVar36 + 1;
                } while (cVar46 == '\0' && puVar36 != puStack_1980);
              }
              p_Var29 = p_Stack_19a0;
              uVar30 = (int)p_Stack_19a0 * auStack_1a50._88_4_ + (int)p_Stack_19b0;
              psVar14 = (secp256k1_context *)auStack_17d0;
              uVar30 = secp256k1_gej_eq_ge_var
                                 ((secp256k1_gej *)psVar14,
                                  (secp256k1_ge *)
                                  (auStack_d50 +
                                  (ulong)(uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc)) * 0x68));
              uVar25 = (ulong)uVar30;
              if (uVar30 == 0) goto LAB_00114a98;
              p_Var29 = p_Var29 + 1;
            } while (p_Var29 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          uStack_19c8 = uStack_19c8 + 1;
        } while (uStack_19c8 != 0xd);
        auStack_1a50._80_8_ = auStack_1a50._80_8_ + 1;
      } while (auStack_1a50._80_8_ != 0xd);
      auStack_1a50._88_8_ = auStack_1a50._88_8_ + 1;
    } while (auStack_1a50._88_8_ != 0xd);
    auStack_1a50._72_8_ = auStack_1a50._72_8_ + 1;
  } while (auStack_1a50._72_8_ != 0xd);
  if (psVar15 != (secp256k1_scratch *)0x0) {
    lVar9 = 0;
    do {
      bVar2 = psVar15->magic[lVar9];
      bVar3 = "scratch"[lVar9];
      psVar42 = (secp256k1_context *)(ulong)bVar3;
      uVar20 = (ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        uVar20 = uVar25;
      }
      iVar47 = (int)uVar20;
      if (bVar2 != bVar3) goto LAB_001134f6;
      lVar9 = lVar9 + 1;
      uVar25 = uVar20;
    } while (lVar9 != 8);
    iVar47 = 0;
LAB_001134f6:
    if (iVar47 == 0) {
      if (psVar15->alloc_size != 0) goto LAB_00114b06;
      psVar15->magic[0] = '\0';
      psVar15->magic[1] = '\0';
      psVar15->magic[2] = '\0';
      psVar15->magic[3] = '\0';
      psVar15->magic[4] = '\0';
      psVar15->magic[5] = '\0';
      psVar15->magic[6] = '\0';
      psVar15->magic[7] = '\0';
      free(psVar15);
      na = psVar15;
    }
    else {
      (*(psStack_1b10->error_callback).fn)
                ("invalid scratch space",(psStack_1b10->error_callback).data);
      na = psVar15;
    }
  }
  iVar47 = 1;
  pFStack_1b30 = (FILE *)0x0;
  do {
    iVar6 = 1;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        pFStack_1b30 = (FILE *)((long)pFStack_1b30 + 0xe7037ed1a0b428db);
        bVar52 = (uint32_t)
                 (((ulong)pFStack_1b30 >> 0x20 ^ (ulong)pFStack_1b30 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        auStack_1970._0_4_ = 1;
        iVar27 = 1;
        do {
          auStack_1a50._0_4_ = iVar47;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
          auStack_1ac0._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
          auStack_1050 = (undefined1  [16])0x0;
          auStack_1040._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1040[0xf] = (char)iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
          auStack_17d0 = (undefined1  [16])0x0;
          auStack_17c0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_17c0[0xf] = (char)iVar47;
          psVar42 = psStack_1b10;
          iVar7 = secp256k1_ecdsa_sign
                            (psStack_1b10,(secp256k1_ecdsa_signature *)asStack_14d0,auStack_17d0,
                             auStack_1050,secp256k1_nonce_function_smallint,auStack_1970);
          if (iVar7 != 1) goto LAB_00114af2;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1a80,(uchar *)asStack_14d0,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_19f0,
                     (uchar *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          psVar42 = (secp256k1_context *)auStack_1ae0;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_d50,auStack_1970._0_4_,
                   (int *)0x0);
          if (auStack_1a80._0_4_ != auStack_1ae0._0_4_) goto LAB_00114af7;
          uVar4 = auStack_1970._0_4_;
          uVar33 = auStack_19f0._0_4_ * auStack_1970._0_4_;
          uVar30 = auStack_1a80._0_4_ * iVar6 + iVar47;
          na = (secp256k1_scratch *)(ulong)((uVar30 / 0xd) * 3);
          iVar7 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
          if (uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc) != iVar7) {
            uVar30 = (0xd - auStack_19f0._0_4_) * auStack_1970._0_4_;
            psVar42 = (secp256k1_context *)(ulong)((uVar30 / 0xd) * 3);
            if (uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar7) goto LAB_00114afc;
          }
          if ((int)auStack_1970._0_4_ < iVar27) break;
          iVar27 = auStack_1970._0_4_ + 1;
          auStack_1970._0_4_ = iVar27;
        } while ((int)uVar4 < 0xc);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    iVar47 = iVar47 + 1;
  } while (iVar47 != 0xd);
  uStack_1b28._0_4_ = 1;
  uStack_1b20 = 0;
  do {
    iVar47 = 1;
    do {
      iVar6 = 1;
      do {
        puVar36 = (undefined1 *)0x1;
        do {
          bVar52 = true;
          if ((ulong)num_cores != 1) {
            uStack_1b20 = uStack_1b20 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)
                     ((uStack_1b20 >> 0x20 ^ uStack_1b20 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            auStack_19f0._0_4_ = (uint)uStack_1b28;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            auStack_1a80._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1a50._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1ac0._0_4_ = (int)puVar36;
            puStack_1b00 = puVar36;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
            uVar30 = 0;
            iVar27 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_14d0,(secp256k1_ge *)auStack_d50,iVar27,
                       (int *)0x0);
              if (iVar47 == asStack_14d0[0].ecmult_gen_ctx.built) {
                auStack_1ae0._0_4_ = iVar27;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1ae0,(secp256k1_scalar *)auStack_1ae0,
                           (secp256k1_scalar *)auStack_19f0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1a80,
                           (secp256k1_scalar *)auStack_1ac0);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1b14,
                           (secp256k1_scalar *)auStack_1a50);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                uVar30 = uVar30 | (uchar  [4])auStack_1ae0._0_4_ == auStack_1b14;
              }
              iVar27 = iVar27 + 1;
            } while (iVar27 != 0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)auStack_1050,(secp256k1_scalar *)auStack_1a80,
                       (secp256k1_scalar *)auStack_19f0);
            puVar36 = puStack_1b00;
            puVar39 = (undefined8 *)(auStack_d50 + (long)puStack_1b00 * 0x68);
            psVar42 = asStack_14d0;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar1 = *puVar39;
              (psVar42->ecmult_gen_ctx).built = (int)uVar1;
              (psVar42->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              psVar42 = (secp256k1_context *)((long)psVar42 + (ulong)bVar53 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_17d0,(secp256k1_ge *)asStack_14d0);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            auStack_1970 = (undefined1  [16])0x0;
            auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1960[0xf] = (char)iVar6;
            psVar42 = psStack_1b10;
            uVar33 = secp256k1_ecdsa_verify
                               (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_1050,auStack_1970,
                                (secp256k1_pubkey *)auStack_17d0);
            if (((uint)uStack_1b28 < 7 & uVar30) != uVar33) goto LAB_00114b01;
          }
          puVar36 = puVar36 + 1;
        } while (puVar36 != (undefined1 *)0xd);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
      iVar47 = iVar47 + 1;
    } while (iVar47 != 0xd);
    uStack_1b28._0_4_ = (uint)uStack_1b28 + 1;
  } while ((uint)uStack_1b28 != 0xd);
  iVar47 = 1;
  uStack_1b20 = 0;
  do {
    iVar6 = 1;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        uStack_1b20 = uStack_1b20 + 0xe7037ed1a0b428db;
        bVar52 = (uint32_t)
                 ((uStack_1b20 >> 0x20 ^ uStack_1b20 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar52) {
        auStack_1a50._0_4_ = 1;
        iVar27 = 1;
        do {
          auStack_19f0._0_4_ = iVar47;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
          auStack_1a80._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
          auStack_1970 = (undefined1  [16])0x0;
          auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1960[0xf] = (char)iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
          auStack_1ac0 = (undefined1  [16])0x0;
          auStack_1ab0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1ab0[0xf] = (char)iVar47;
          secp256k1_ecdsa_sign_recoverable
                    (psStack_1b10,(secp256k1_ecdsa_recoverable_signature *)asStack_14d0,auStack_1ac0
                     ,auStack_1970,secp256k1_nonce_function_smallint,auStack_1a50);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1ae0,(uchar *)asStack_14d0,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b14,
                     (uchar *)(asStack_14d0[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          bVar2 = (byte)asStack_14d0[0].ecmult_gen_ctx.ge_offset.y.n[1];
          psVar42 = (secp256k1_context *)auStack_1b04;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_d50,auStack_1a50._0_4_,
                   (int *)&sStack_1ae4);
          auVar28 = auStack_1b14;
          if ((undefined1  [4])auStack_1ae0._0_4_ != auStack_1b04) goto LAB_00114b0b;
          lVar9 = (long)(int)auStack_1a50._0_4_;
          uVar30 = (int)auStack_1b14 * auStack_1a50._0_4_;
          uVar33 = auStack_1ae0._0_4_ * iVar6 + iVar47;
          iVar7 = uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc);
          if ((uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar7) &&
             (uVar30 = (0xd - (int)auStack_1b14) * auStack_1a50._0_4_,
             uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar7)) goto LAB_00114b10;
          uVar30 = (uint)(sStack_1ae4 != 0) * 2;
          lVar31 = lVar9 * 0x68;
          auStack_17b0 = *(uchar (*) [4])(auStack_d00 + lVar31);
          auStack_17ac = *(uchar (*) [4])(auStack_cfc + lVar31);
          iStack_17a8 = aiStack_cf8[lVar9 * 0x1a];
          iStack_17a4 = aiStack_cf8[lVar9 * 0x1a + 1];
          auStack_17d0._8_8_ = asStack_d18[lVar9 * 0xd];
          auStack_17d0._0_8_ = *(undefined8 *)(auStack_d20 + lVar31);
          auStack_17c0._8_8_ = *(undefined8 *)(auStack_d00 + lVar31 + -8);
          auStack_17c0._0_8_ = asStack_d18[lVar9 * 0xd + 1];
          psVar42 = (secp256k1_context *)auStack_17d0;
          secp256k1_fe_normalize((secp256k1_fe *)psVar42);
          uVar33 = (int)auVar28 * auStack_1a50._0_4_;
          secp256k1_fe_verify((secp256k1_fe *)psVar42);
          if (uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc) == iVar7) {
            if (iStack_17a4 == 0) goto LAB_00114b15;
            uVar30 = auStack_17d0._0_4_ & 1 | uVar30;
          }
          else {
            if (iStack_17a4 == 0) goto LAB_00114b1a;
            uVar30 = (auStack_17d0._0_4_ & 1 | uVar30) ^ 1;
          }
          if (uVar30 != bVar2) goto LAB_00114b1f;
          secp256k1_ecdsa_recoverable_signature_convert
                    (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_1050,
                     (secp256k1_ecdsa_recoverable_signature *)asStack_14d0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1ae0,(uchar *)auStack_1050,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b14,(uchar *)&uStack_1030,(int *)0x0);
          psVar42 = (secp256k1_context *)auStack_1b04;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_d50,auStack_1a50._0_4_,
                   (int *)0x0);
          if ((undefined1  [4])auStack_1ae0._0_4_ != auStack_1b04) goto LAB_00114b24;
          uVar4 = auStack_1a50._0_4_;
          uVar33 = (int)auStack_1b14 * auStack_1a50._0_4_;
          uVar30 = auStack_1ae0._0_4_ * iVar6 + iVar47;
          na = (secp256k1_scratch *)(ulong)((uVar30 / 0xd) * 3);
          iVar7 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
          if (uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc) != iVar7) {
            uVar30 = (0xd - (int)auStack_1b14) * auStack_1a50._0_4_;
            psVar42 = (secp256k1_context *)(ulong)((uVar30 / 0xd) * 3);
            if (uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar7) goto LAB_00114b29;
          }
          if ((int)auStack_1a50._0_4_ < iVar27) break;
          iVar27 = auStack_1a50._0_4_ + 1;
          auStack_1a50._0_4_ = iVar27;
        } while ((int)uVar4 < 0xc);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    iVar47 = iVar47 + 1;
  } while (iVar47 != 0xd);
  pFStack_1b30._0_4_ = 1;
  uStack_1b28 = 0;
  do {
    iVar47 = 1;
    do {
      iVar6 = 1;
      do {
        lVar9 = 1;
        do {
          bVar52 = true;
          if ((ulong)num_cores != 1) {
            uStack_1b28 = uStack_1b28 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)
                     ((uStack_1b28 >> 0x20 ^ uStack_1b28 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            auStack_1ae0._0_4_ = (uint)pFStack_1b30;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
            auStack_19f0._0_4_ = iVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
            auStack_1a80._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1a50._0_4_ = (int)lVar9;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a50);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a80);
            auStack_1ac0 = (undefined1  [16])0x0;
            auStack_1ab0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1ab0[0xf] = (char)iVar6;
            uVar30 = 0;
            auVar28[0] = '\0';
            auVar28[1] = '\0';
            auVar28[2] = '\0';
            auVar28[3] = '\0';
            do {
              r_from_k((secp256k1_scalar *)asStack_14d0,(secp256k1_ge *)auStack_d50,(int)auVar28,
                       (int *)0x0);
              if (iVar47 == asStack_14d0[0].ecmult_gen_ctx.built) {
                auStack_1b14 = auVar28;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b14,(secp256k1_scalar *)auStack_1b14,
                           (secp256k1_scalar *)auStack_1ae0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1b04,(secp256k1_scalar *)auStack_19f0,
                           (secp256k1_scalar *)auStack_1a50);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1b04,(secp256k1_scalar *)auStack_1b04,
                           (secp256k1_scalar *)auStack_1a80);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b14);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b04);
                uVar30 = uVar30 | auStack_1b14 == (uchar  [4])auStack_1b04;
              }
              auVar28 = (uchar  [4])((int)auVar28 + 1);
            } while (auVar28 != (uchar  [4])0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ae0);
            secp256k1_ecdsa_recoverable_signature_save
                      ((secp256k1_ecdsa_recoverable_signature *)auStack_1050,
                       (secp256k1_scalar *)auStack_19f0,(secp256k1_scalar *)auStack_1ae0,0);
            psVar42 = psStack_1b10;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psStack_1b10,(secp256k1_ecdsa_signature *)auStack_17d0,
                       (secp256k1_ecdsa_recoverable_signature *)auStack_1050);
            puVar39 = (undefined8 *)(auStack_d50 + lVar9 * 0x68);
            psVar14 = asStack_14d0;
            for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
              uVar1 = *puVar39;
              (psVar14->ecmult_gen_ctx).built = (int)uVar1;
              (psVar14->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              psVar14 = (secp256k1_context *)((long)psVar14 + (ulong)bVar53 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1970,(secp256k1_ge *)asStack_14d0);
            uVar33 = secp256k1_ecdsa_verify
                               (psVar42,(secp256k1_ecdsa_signature *)auStack_17d0,auStack_1ac0,
                                (secp256k1_pubkey *)auStack_1970);
            if (((uint)pFStack_1b30 < 7 & uVar30) != uVar33) goto LAB_00114b2e;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0xd);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
      iVar47 = iVar47 + 1;
    } while (iVar47 != 0xd);
    pFStack_1b30._0_4_ = (uint)pFStack_1b30 + 1;
  } while ((uint)pFStack_1b30 != 0xd);
  pFStack_1b30 = (FILE *)0x1;
  puVar36 = auStack_1810;
  puVar32 = auStack_1970;
  do {
    auStack_19f0._0_4_ = (int)pFStack_1b30;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_19f0);
    auStack_1a80 = (undefined1  [16])0x0;
    auStack_1a70._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1a70[0xf] = (char)pFStack_1b30;
    lVar9 = (long)pFStack_1b30 - 1;
    keypair = (secp256k1_keypair *)
              ((long)(&asStack_14d0[0].ecmult_gen_ctx.ge_offset + -1) + (long)pFStack_1b30 * 0x60);
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_keypair_create(psStack_1b10,keypair,auStack_1a80);
    if (iVar47 == 0) goto LAB_00114b33;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_ec_pubkey_create
                       (psStack_1b10,(secp256k1_pubkey *)(auStack_1050 + lVar9 * 0x40),auStack_1a80)
    ;
    if (iVar47 == 0) goto LAB_00114b38;
    psVar51 = (secp256k1_xonly_pubkey *)(auStack_17d0 + lVar9 * 0x40);
    pk_parity = (uchar (*) [4])(auStack_1ac0 + lVar9 * 4);
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_keypair_xonly_pub(psStack_1b10,psVar51,(int *)pk_parity,keypair);
    if (iVar47 == 0) goto LAB_00114b3d;
    puVar50 = auStack_1970 + lVar9 * 0x20;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,puVar50,psVar51);
    if (iVar47 == 0) goto LAB_00114b42;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_parse(psStack_1b10,psVar51,puVar50);
    if (iVar47 == 0) goto LAB_00114b47;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,auStack_1a80,psVar51);
    if (iVar47 == 0) goto LAB_00114b4c;
    lVar31 = 0;
    do {
      bVar2 = auStack_1a80[lVar31];
      psVar42 = (secp256k1_context *)(ulong)bVar2;
      iVar47 = (uint)(byte)puVar32[lVar31] - (uint)bVar2;
      if (puVar32[lVar31] != bVar2) goto LAB_00114123;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 0x20);
    iVar47 = 0;
LAB_00114123:
    if (iVar47 != 0) goto LAB_00114b51;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_from_pubkey
                       (psStack_1b10,psVar51,(int *)auStack_1ae0,
                        (secp256k1_pubkey *)(auStack_1050 + lVar9 * 0x40));
    if (iVar47 == 0) goto LAB_00114b56;
    if ((uchar  [4])auStack_1ae0._0_4_ != *pk_parity) goto LAB_00114b5b;
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_serialize(psStack_1b10,auStack_1a80,psVar51);
    if (iVar47 == 0) goto LAB_00114b60;
    lVar9 = 0;
    do {
      bVar2 = auStack_1a80[lVar9];
      psVar42 = (secp256k1_context *)(ulong)bVar2;
      iVar47 = (uint)(byte)puVar32[lVar9] - (uint)bVar2;
      if (puVar32[lVar9] != bVar2) goto LAB_0011419e;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x20);
    iVar47 = 0;
LAB_0011419e:
    if (iVar47 != 0) goto LAB_00114b65;
    psVar42 = (secp256k1_context *)auStack_1a50;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar42,puVar50);
    auStack_1a50._40_8_ = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar42);
    lVar9 = (long)pFStack_1b30 * 0x68;
    iVar47 = secp256k1_fe_equal((secp256k1_fe *)psVar42,(secp256k1_fe *)(auStack_d50 + lVar9));
    if (iVar47 == 0) goto LAB_00114b6a;
    auStack_1a50._0_8_ = *(uchar (*) [8])(auStack_d20 + lVar9);
    auStack_1a50._8_8_ = asStack_d18[(long)pFStack_1b30 * 0xd];
    auStack_1a50._16_8_ = asStack_d18[(long)pFStack_1b30 * 0xd + 1];
    auStack_1a50._24_8_ = *(undefined8 *)(auStack_d00 + lVar9 + -8);
    auStack_1a50._32_4_ = *(undefined4 *)(auStack_d00 + lVar9);
    auStack_1a50._36_4_ = *(undefined4 *)(auStack_cfc + lVar9);
    auStack_1a50._44_4_ = aiStack_cf8[(long)pFStack_1b30 * 0x1a + 1];
    auStack_1a50._40_4_ = aiStack_cf8[(long)pFStack_1b30 * 0x1a];
    psVar42 = (secp256k1_context *)auStack_1a50;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar42);
    secp256k1_fe_verify((secp256k1_fe *)psVar42);
    if (auStack_1a50._44_4_ == 0) goto LAB_00114b6f;
    if ((uchar  [4])(auStack_1a50._0_4_ & 1) != *pk_parity) goto LAB_00114b74;
    if (6 < pFStack_1b30) {
      lVar9 = 0;
      psVar14 = extraout_RDX;
      do {
        psVar42 = (secp256k1_context *)((ulong)psVar14 & 0xffffffff);
        bVar2 = puVar32[lVar9];
        na = (secp256k1_scratch *)(ulong)bVar2;
        bVar3 = puVar36[lVar9];
        psVar14 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar14 = psVar42;
        }
        iVar47 = (int)psVar14;
        if (bVar2 != bVar3) goto LAB_0011428f;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      iVar47 = 0;
LAB_0011428f:
      if (iVar47 != 0) goto LAB_00114b79;
      if (*pk_parity != (uchar  [4])(1U - *(int *)(auStack_1ac0 + (0xc - (long)pFStack_1b30) * 4)))
      goto LAB_00114b7e;
    }
    pFStack_1b30 = (FILE *)((long)pFStack_1b30 + 1);
    puVar32 = puVar32 + 0x20;
    puVar36 = puVar36 + -0x20;
  } while (pFStack_1b30 != (FILE *)0xd);
  lVar9 = 0;
  do {
    psVar42 = psStack_1b10;
    iVar47 = secp256k1_xonly_pubkey_parse
                       (psStack_1b10,(secp256k1_xonly_pubkey *)asStack_14d0,
                        invalid_pubkey_bytes[0] + lVar9);
    if (iVar47 != 0) goto LAB_00114b83;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0xe0);
  iVar47 = 1;
  psVar14 = asStack_14d0;
  psVar51 = (secp256k1_xonly_pubkey *)auStack_1050;
  puVar50 = auStack_17d0;
  lVar9 = 0;
  do {
    auStack_1ac0._0_4_ = iVar47;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    auStack_1970 = (undefined1  [16])0x0;
    auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1960[0xf] = (char)iVar47;
    psVar42 = psStack_1b10;
    iVar6 = secp256k1_keypair_create(psStack_1b10,(secp256k1_keypair *)psVar14,auStack_1970);
    if (iVar6 == 0) goto LAB_00114b88;
    psVar42 = psStack_1b10;
    iVar6 = secp256k1_keypair_xonly_pub
                      (psStack_1b10,psVar51,(int *)(auStack_1a50 + lVar9),
                       (secp256k1_keypair *)psVar14);
    if (iVar6 == 0) goto LAB_00114b8d;
    psVar42 = psStack_1b10;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1b10,puVar50,psVar51);
    if (iVar6 == 0) goto LAB_00114b92;
    lVar9 = lVar9 + 4;
    puVar50 = puVar50 + 0x20;
    psVar51 = psVar51 + 1;
    psVar14 = (secp256k1_context *)&(psVar14->ecmult_gen_ctx).ge_offset.y.magnitude;
    iVar47 = iVar47 + 1;
  } while (lVar9 != 0x30);
  auStack_1ae0._16_8_ = (uchar *)0x0;
  auStack_1ae0._0_8_ = 0x8cb36fda;
  auStack_1ae0._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  uStack_1b20 = 1;
  uStack_1b28 = 0;
  do {
    iVar47 = 0xd - (int)uStack_1b20;
    if ((&iStack_1a54)[uStack_1b20] == 0) {
      iVar47 = (int)uStack_1b20;
    }
    auStack_1b14[0] = '\x01';
    auStack_1b14[1] = '\0';
    auStack_1b14[2] = '\0';
    auStack_1b14[3] = '\0';
    do {
      auStack_1aa0 = (undefined1  [16])0x0;
      auStack_1ab0 = (undefined1  [16])0x0;
      auStack_1ac0 = (undefined1  [16])0x0;
      uStack_1a90 = 0;
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        uStack_1b28 = uStack_1b28 + 0xe7037ed1a0b428db;
        bVar52 = (uint32_t)
                 ((uStack_1b28 >> 0x20 ^ uStack_1b28 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar52) {
        auStack_1ae0._8_8_ = secp256k1_hardened_nonce_function_smallint;
        auStack_1ae0._16_8_ = auStack_1b14;
        auVar28 = (uchar  [4])(0xd - (int)auStack_1b14);
        if ((&iStack_1a54)[(int)auStack_1b14] == 0) {
          auVar28 = auStack_1b14;
        }
        iVar6 = 0;
        do {
          testrand256(auStack_1a80);
          na = (secp256k1_scratch *)(auStack_17d0 + (uStack_1b20 + -1) * 0x20);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1b04,abStack_17f0 + (long)(int)auStack_1b14 * 0x20,
                     auStack_1a80,0x20,(uchar *)(auStack_17d0 + (uStack_1b20 + -1) * 0x20));
          uVar25 = (ulong)(uint)auStack_1b04;
          if (*(int *)(auStack_1ac0 + uVar25 * 4) == 0) {
            uVar30 = (int)auStack_1b04 * iVar47 + (int)auVar28;
            sVar48 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
            sStack_1ae4 = sVar48;
            secp256k1_scalar_verify(&sStack_1ae4);
            auStack_19f0 = (undefined1  [16])0x0;
            auStack_19e0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_19e0[0xf] = (char)sVar48;
            psVar42 = psStack_1b10;
            iVar27 = secp256k1_schnorrsig_sign_custom
                               (psStack_1b10,auStack_1970,auStack_1a80,0x20,
                                (secp256k1_keypair *)
                                ((long)(&asStack_14d0[0].ecmult_gen_ctx.ge_offset + -1) +
                                uStack_1b20 * 0x60),(secp256k1_schnorrsig_extraparams *)auStack_1ae0
                               );
            if (iVar27 == 0) goto LAB_00114b97;
            pbVar24 = abStack_17f0;
            pbVar19 = pbVar24 + (long)(int)auStack_1b14 * 0x20;
            lVar9 = 0;
            do {
              pbVar40 = (byte *)((ulong)pbVar24 & 0xffffffff);
              bVar2 = auStack_1970[lVar9];
              psVar42 = (secp256k1_context *)(ulong)bVar2;
              bVar3 = pbVar19[lVar9];
              na = (secp256k1_scratch *)(ulong)bVar3;
              pbVar24 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar24 = pbVar40;
              }
              iVar27 = (int)pbVar24;
              if (bVar2 != bVar3) goto LAB_001145da;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x20);
            iVar27 = 0;
LAB_001145da:
            if (iVar27 != 0) goto LAB_00114b9c;
            lVar9 = 0;
            do {
              pbVar24 = (byte *)((ulong)pbVar19 & 0xffffffff);
              bVar2 = auStack_1950[lVar9];
              bVar3 = auStack_19f0[lVar9];
              psVar42 = (secp256k1_context *)(ulong)bVar3;
              pbVar19 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar19 = pbVar24;
              }
              iVar27 = (int)pbVar19;
              if (bVar2 != bVar3) goto LAB_0011460d;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x20);
            iVar27 = 0;
LAB_0011460d:
            if (iVar27 != 0) goto LAB_00114ba1;
            *(undefined4 *)(auStack_1ac0 + uVar25 * 4) = 1;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < 0xd);
      }
      auVar28 = (uchar  [4])((int)auStack_1b14 + 1);
      bVar52 = (int)auStack_1b14 < 0xc;
      auStack_1b14 = auVar28;
    } while (bVar52);
    uStack_1b20 = uStack_1b20 + 1;
  } while (uStack_1b20 != 0xd);
  puStack_1b00 = (undefined1 *)0x1;
  puStack_1af8 = (undefined1 *)0x0;
  do {
    puVar36 = puStack_1b00 + -1;
    lVar9 = (long)puVar36 * 0x20;
    auStack_1a70 = *(undefined1 (*) [16])(auStack_17c0 + lVar9);
    iVar47 = 0xd - (int)puStack_1b00;
    if ((&iStack_1a54)[(long)puStack_1b00] == 0) {
      iVar47 = (int)puStack_1b00;
    }
    psStack_1af0 = (secp256k1_gej *)CONCAT44(psStack_1af0._4_4_,iVar47);
    auStack_1a80._8_8_ = *(undefined8 *)(auStack_17d0 + lVar9 + 8);
    auStack_1a80._0_8_ = *(undefined8 *)(auStack_17d0 + lVar9);
    uStack_1b20 = 1;
    do {
      uVar1 = auStack_1a50._64_8_;
      auStack_1aa0 = (undefined1  [16])0x0;
      auStack_1ab0 = (undefined1  [16])0x0;
      auStack_1ac0 = (undefined1  [16])0x0;
      uStack_1a90 = 0;
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        puStack_1af8 = puStack_1af8 + -0x18fc812e5f4bd725;
        bVar52 = (uint32_t)
                 (((ulong)puStack_1af8 >> 0x20 ^ (ulong)puStack_1af8 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        iVar47 = (int)uStack_1b20;
        if (uStack_1b20 < 7) {
          lVar9 = (uStack_1b20 - 1) * 0x20;
          auStack_1960 = *(undefined1 (*) [16])(auStack_17c0 + lVar9);
          auStack_1970._8_8_ = *(undefined8 *)(auStack_17d0 + lVar9 + 8);
          auStack_1970._0_8_ = *(undefined8 *)(auStack_17d0 + lVar9);
          iVar6 = 0xd - iVar47;
          if ((&iStack_1a54)[uStack_1b20] == 0) {
            iVar6 = iVar47;
          }
        }
        else {
          auStack_1970 = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar47 - 7U];
          auStack_1960 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar47 - 7U] + 0x10);
          iVar6 = -1;
        }
        auStack_1a50._65_3_ = 0;
        auStack_1a50[0x40] = iVar6 != -1;
        auStack_1a50._68_4_ = SUB84(uVar1,4);
        iVar47 = 0;
        do {
          testrand256(auStack_19f0);
          na = (secp256k1_scratch *)auStack_1a80;
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1ae0,auStack_1970,auStack_19f0,0x20,(uchar *)na);
          uVar25 = auStack_1ae0._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1ac0 + uVar25 * 4) == 0) {
            uVar30 = (int)auStack_1ae0._0_8_ * (int)psStack_1af0 + iVar6;
            iVar7 = 0;
            iVar27 = 0;
            do {
              if (iVar7 == 0xe) {
                testrand256(auStack_1950);
                uVar33 = 0;
              }
              else {
                auStack_1950 = (undefined1  [16])0x0;
                auStack_1940._0_12_ = SUB1612((undefined1  [16])0x0,0);
                auStack_1940._12_4_ = 0;
                uVar33 = 0;
                if (iVar7 != 0xd && iVar6 != -1) {
                  uVar33 = (uint)(uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) == iVar7);
                }
              }
              psVar42 = psStack_1b10;
              na = (secp256k1_scratch *)(auStack_1050 + (long)puVar36 * 0x40);
              uVar8 = secp256k1_schnorrsig_verify
                                (psStack_1b10,auStack_1970,auStack_19f0,0x20,
                                 (secp256k1_xonly_pubkey *)(auStack_1050 + (long)puVar36 * 0x40));
              if (uVar8 != uVar33) goto LAB_00114ba6;
              iVar27 = iVar27 + uVar8;
              iVar7 = iVar7 + 1;
            } while (iVar7 != 0xf);
            if (iVar27 != auStack_1a50._64_4_) goto LAB_00114bab;
            *(undefined4 *)(auStack_1ac0 + uVar25 * 4) = 1;
            iVar47 = iVar47 + 1;
          }
        } while (iVar47 < 0xd);
      }
      uStack_1b20 = uStack_1b20 + 1;
    } while (uStack_1b20 != 0xe);
    puStack_1b00 = puStack_1b00 + 1;
  } while (puStack_1b00 != (undefined1 *)0x7);
  lVar9 = 0x68;
  iVar47 = 1;
  do {
    auStack_1ac0._0_4_ = iVar47;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1ac0);
    auStack_1970 = (undefined1  [16])0x0;
    auStack_1960._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1960[0xf] = (char)iVar47;
    psVar42 = psStack_1b10;
    iVar6 = secp256k1_ellswift_create(psStack_1b10,auStack_1050,auStack_1970,(uchar *)0x0);
    psVar14 = psStack_1b10;
    if (iVar6 == 0) goto LAB_00114bb0;
    secp256k1_ellswift_decode(psStack_1b10,(secp256k1_pubkey *)auStack_17d0,auStack_1050);
    psVar42 = asStack_14d0;
    secp256k1_pubkey_load(psVar14,(secp256k1_ge *)psVar42,(secp256k1_pubkey *)auStack_17d0);
    iVar6 = secp256k1_ge_eq_var((secp256k1_ge *)psVar42,(secp256k1_ge *)(auStack_d50 + lVar9));
    if (iVar6 == 0) goto LAB_00114bb5;
    lVar9 = lVar9 + 0x68;
    iVar47 = iVar47 + 1;
  } while (lVar9 != 0x548);
  secp256k1_context_destroy(psStack_1b10);
  iVar47 = count;
  goto joined_r0x0011246c;
LAB_00114a70:
  main_cold_4();
LAB_00114a75:
  main_cold_5();
LAB_00114a7a:
  main_cold_6();
LAB_00114a7f:
  main_cold_69();
LAB_00114a84:
  main_cold_68();
LAB_00114a89:
  main_cold_67();
LAB_00114a8e:
  main_cold_7();
LAB_00114a93:
  main_cold_8();
LAB_00114a98:
  main_cold_50();
LAB_00114a9d:
  psVar42 = psVar14;
  main_cold_61();
LAB_00114aa2:
  main_cold_60();
LAB_00114aa7:
  main_cold_59();
LAB_00114aac:
  main_cold_58();
LAB_00114ab1:
  main_cold_56();
LAB_00114ab6:
  psVar14 = psVar42;
  main_cold_55();
LAB_00114abb:
  main_cold_54();
LAB_00114ac0:
  psVar42 = psVar14;
  main_cold_52();
LAB_00114ac5:
  main_cold_51();
LAB_00114aca:
  main_cold_71();
LAB_00114acf:
  main_cold_3();
LAB_00114ad4:
  main_cold_70();
LAB_00114ad9:
  main_cold_66();
LAB_00114ade:
  main_cold_65();
  goto LAB_00114ae3;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}